

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * slang::ast::anon_unknown_292::recursePrimArray
                   (Compilation *comp,PrimitiveSymbol *primitive,
                   HierarchicalInstanceSyntax *instance,ASTContext *context,DimIterator it,
                   DimIterator end,
                   span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   attributes,SmallVectorBase<unsigned_int> *path)

{
  SourceLocation SVar1;
  SourceRange sourceRange;
  string_view name;
  string_view arg;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes_00;
  bool bVar2;
  bitwidth_t bVar3;
  reference ppVVar4;
  CompilationOptions *pCVar5;
  HierarchicalInstanceSyntax *pHVar6;
  InstanceArraySymbol *pIVar7;
  iterator ppSVar8;
  HierarchicalInstanceSyntax *in_RCX;
  PrimitiveSymbol *in_RDX;
  EVP_PKEY_CTX *src;
  Compilation *in_RSI;
  DimIterator in_RDI;
  DimIterator in_R9;
  string_view sVar9;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  in_stack_00000000;
  Scope *in_stack_00000010;
  char *in_stack_00000018;
  Symbol *element;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range2;
  InstanceArraySymbol *result;
  Symbol *symbol;
  uint32_t i;
  SmallVector<const_slang::ast::Symbol_*,_5UL> elements;
  Diagnostic *diag;
  ConstantRange range;
  EvaluatedDimension dim;
  VariableDimensionSyntax *dimSyntax;
  Token nameToken;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd88;
  Scope *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  char *__str;
  Diagnostic *in_stack_fffffffffffffda0;
  Compilation *in_stack_fffffffffffffda8;
  SourceLocation in_stack_fffffffffffffdb0;
  SourceLocation in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  DiagCode in_stack_fffffffffffffdc4;
  Diagnostic *in_stack_fffffffffffffdd0;
  size_t in_stack_fffffffffffffdd8;
  SyntaxNode *in_stack_fffffffffffffde0;
  HierarchicalInstanceSyntax *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  uint uVar10;
  undefined4 in_stack_fffffffffffffdf4;
  Compilation *in_stack_fffffffffffffdf8;
  Compilation *in_stack_fffffffffffffe00;
  VariableDimensionSyntax *in_stack_fffffffffffffe08;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe10;
  SmallVectorBase<unsigned_int> *in_stack_fffffffffffffe20;
  iterator local_1b8;
  size_t local_178;
  SyntaxNode *pSStack_170;
  uint local_12c;
  SmallVectorBase<const_slang::ast::Symbol_*> local_128 [2];
  SourceLocation local_e8;
  string_view local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  SourceRange local_c0;
  undefined4 local_ac;
  Diagnostic *local_a8;
  ConstantRange local_a0;
  SourceLocation local_98;
  string_view local_90;
  EvaluatedDimension local_80;
  VariableDimensionSyntax *local_60;
  Token local_58;
  size_t local_48;
  ASTContext *in_stack_ffffffffffffffc0;
  __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
  local_10;
  InstanceArraySymbol *local_8;
  
  uVar10 = (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  bVar2 = __gnu_cxx::
          operator==<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                    ((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffd90,
                     (__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffd88._M_extent_value);
  local_48 = (size_t)in_stack_00000000._M_extent._M_extent_value;
  if (bVar2) {
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x6f66ca);
    attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffe10._M_extent_value;
    attributes_00._M_ptr = (pointer)in_stack_fffffffffffffe08;
    local_8 = (InstanceArraySymbol *)
              createPrimInst(in_stack_fffffffffffffe00,(Scope *)in_stack_fffffffffffffdf8,
                             (PrimitiveSymbol *)
                             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                             in_stack_fffffffffffffde8,attributes_00,in_stack_fffffffffffffe20);
  }
  else {
    SVar1 = (in_RDX->super_Symbol).location;
    local_58._0_8_ = *(undefined8 *)((long)SVar1 + 0x18);
    local_58.info = *(Info **)((long)SVar1 + 0x20);
    ppVVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_10);
    local_60 = *ppVVar4;
    __gnu_cxx::
    __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_10);
    ASTContext::evalDimension
              ((ASTContext *)in_stack_fffffffffffffe10._M_extent_value,in_stack_fffffffffffffe08,
               SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffe00 >> 0x30,0));
    bVar2 = EvaluatedDimension::isRange(&local_80);
    if (bVar2) {
      local_a0 = local_80.range;
      bVar3 = ConstantRange::width((ConstantRange *)0x6f6846);
      pCVar5 = Compilation::getOptions((Compilation *)in_RDI._M_current);
      if (pCVar5->maxInstanceArray < bVar3) {
        local_ac = 0x6d0006;
        local_c0 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffde0);
        sourceRange.endLoc = in_stack_fffffffffffffdb8;
        sourceRange.startLoc = in_stack_fffffffffffffdb0;
        local_a8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffda8,
                                       in_stack_fffffffffffffdc4,sourceRange);
        local_d0 = sv((char *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88._M_extent_value);
        arg._M_str = (char *)in_stack_fffffffffffffde0;
        arg._M_len = in_stack_fffffffffffffdd8;
        Diagnostic::operator<<(in_stack_fffffffffffffdd0,arg);
        Compilation::getOptions((Compilation *)in_RDI._M_current);
        Diagnostic::operator<<<unsigned_int>(in_stack_fffffffffffffda0,uVar10);
        local_e0 = parsing::Token::valueText((Token *)in_stack_fffffffffffffda0);
        local_e8 = parsing::Token::location(&local_58);
        sVar9._M_str._0_4_ = in_stack_fffffffffffffdc0;
        sVar9._M_len = (size_t)in_stack_fffffffffffffdb8;
        sVar9._M_str._4_4_ = in_stack_fffffffffffffdc4;
        local_8 = InstanceArraySymbol::createEmpty
                            (in_stack_fffffffffffffda8,sVar9,in_stack_fffffffffffffdb0);
      }
      else {
        SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x6f69bb);
        local_12c = 0;
        while( true ) {
          uVar10 = local_12c;
          bVar3 = ConstantRange::width((ConstantRange *)0x6f69de);
          if (bVar3 <= uVar10) break;
          SmallVectorBase<unsigned_int>::push_back
                    ((SmallVectorBase<unsigned_int> *)in_stack_fffffffffffffd90,
                     (uint *)in_stack_fffffffffffffd88._M_extent_value);
          in_stack_fffffffffffffd88 = in_stack_00000000._M_extent._M_extent_value;
          in_stack_fffffffffffffd90 = in_stack_00000010;
          __str = in_stack_00000018;
          pHVar6 = (HierarchicalInstanceSyntax *)
                   recursePrimArray(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffc0,in_R9,in_RDI,
                                    in_stack_00000000,
                                    (SmallVectorBase<unsigned_int> *)in_stack_00000010);
          in_stack_fffffffffffffde8 = pHVar6;
          SmallVectorBase<unsigned_int>::pop_back
                    ((SmallVectorBase<unsigned_int> *)in_stack_fffffffffffffd90);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffda0,
                     __str);
          ((string_view *)&(pHVar6->super_SyntaxNode).parent)->_M_len = local_178;
          (pHVar6->super_SyntaxNode).previewNode = pSStack_170;
          SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffd90,
                     (Symbol **)in_stack_fffffffffffffd88._M_extent_value);
          local_12c = local_12c + 1;
        }
        sVar9 = parsing::Token::valueText((Token *)in_stack_fffffffffffffda0);
        parsing::Token::location(&local_58);
        SmallVectorBase<const_slang::ast::Symbol_*>::copy
                  (local_128,(EVP_PKEY_CTX *)in_RDI._M_current,src);
        pIVar7 = BumpAllocator::
                 emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
                           (&in_stack_fffffffffffffe00->super_BumpAllocator,
                            in_stack_fffffffffffffdf8,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            CONCAT44(bVar3,uVar10),(SourceLocation *)in_stack_fffffffffffffde8,
                            (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)sVar9._M_len
                            ,(ConstantRange *)sVar9._M_str);
        local_1b8 = SmallVectorBase<const_slang::ast::Symbol_*>::begin(local_128);
        ppSVar8 = SmallVectorBase<const_slang::ast::Symbol_*>::end(local_128);
        for (; local_1b8 != ppSVar8; local_1b8 = local_1b8 + 1) {
          Scope::addMember(in_stack_fffffffffffffd90,
                           (Symbol *)in_stack_fffffffffffffd88._M_extent_value);
        }
        local_8 = pIVar7;
        SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x6f6cbe);
      }
    }
    else {
      local_90 = parsing::Token::valueText((Token *)in_stack_fffffffffffffda0);
      local_98 = parsing::Token::location(&local_58);
      name._M_str._0_4_ = in_stack_fffffffffffffdc0;
      name._M_len = (size_t)in_stack_fffffffffffffdb8;
      name._M_str._4_4_ = in_stack_fffffffffffffdc4;
      local_8 = InstanceArraySymbol::createEmpty
                          (in_stack_fffffffffffffda8,name,in_stack_fffffffffffffdb0);
    }
  }
  return &local_8->super_Symbol;
}

Assistant:

Symbol* recursePrimArray(Compilation& comp, const PrimitiveSymbol& primitive,
                         const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                         DimIterator it, DimIterator end,
                         std::span<const AttributeInstanceSyntax* const> attributes,
                         SmallVectorBase<uint32_t>& path) {
    if (it == end)
        return createPrimInst(comp, *context.scope, primitive, instance, attributes, path);

    SLANG_ASSERT(instance.decl);
    auto nameToken = instance.decl->name;
    auto& dimSyntax = **it;
    ++it;

    // Evaluate the dimensions of the array. If this fails for some reason,
    // make up an empty array so that we don't get further errors when
    // things try to reference this symbol.
    auto dim = context.evalDimension(dimSyntax, /* requireRange */ true, /* isPacked */ false);
    if (!dim.isRange())
        return &InstanceArraySymbol::createEmpty(comp, nameToken.valueText(), nameToken.location());

    ConstantRange range = dim.range;
    if (range.width() > comp.getOptions().maxInstanceArray) {
        auto& diag = context.addDiag(diag::MaxInstanceArrayExceeded, dimSyntax.sourceRange());
        diag << "primitive"sv << comp.getOptions().maxInstanceArray;
        return &InstanceArraySymbol::createEmpty(comp, nameToken.valueText(), nameToken.location());
    }

    SmallVector<const Symbol*> elements;
    for (uint32_t i = 0; i < range.width(); i++) {
        path.push_back(i);
        auto symbol = recursePrimArray(comp, primitive, instance, context, it, end, attributes,
                                       path);
        path.pop_back();

        symbol->name = "";
        elements.push_back(symbol);
    }

    auto result = comp.emplace<InstanceArraySymbol>(comp, nameToken.valueText(),
                                                    nameToken.location(), elements.copy(comp),
                                                    range);
    for (auto element : elements)
        result->addMember(*element);

    return result;
}